

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_describe_scheduled_tasks.cc
# Opt level: O0

int __thiscall
aliyun::Ess::DescribeScheduledTasks
          (Ess *this,EssDescribeScheduledTasksRequestType *req,
          EssDescribeScheduledTasksResponseType *response,EssErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AliRpcRequest *pAVar4;
  ulong uVar5;
  Value *pVVar6;
  bool local_1672;
  allocator<char> local_1671;
  string local_1670;
  byte local_164a;
  allocator<char> local_1649;
  string local_1648;
  byte local_1622;
  allocator<char> local_1621;
  string local_1620;
  byte local_15fa;
  allocator<char> local_15f9;
  string local_15f8;
  allocator<char> local_15d1;
  string local_15d0;
  allocator<char> local_15a9;
  string local_15a8;
  string local_1588;
  allocator<char> local_1561;
  string local_1560;
  string local_1540;
  allocator<char> local_1519;
  string local_1518;
  string local_14f8;
  allocator<char> local_14d1;
  string local_14d0;
  string local_14b0;
  allocator<char> local_1489;
  string local_1488;
  string local_1468;
  allocator<char> local_1441;
  string local_1440;
  string local_1420;
  allocator<char> local_13f9;
  string local_13f8;
  string local_13d8;
  allocator<char> local_13b1;
  string local_13b0;
  string local_1390;
  allocator<char> local_1369;
  string local_1368;
  string local_1348;
  allocator<char> local_1321;
  string local_1320;
  string local_1300;
  allocator<char> local_12d9;
  string local_12d8;
  string local_12b8;
  allocator<char> local_1291;
  string local_1290;
  string local_1270;
  allocator<char> local_1249;
  string local_1248;
  string local_1228;
  allocator<char> local_1201;
  string local_1200;
  string local_11e0;
  allocator<char> local_11b9;
  string local_11b8;
  string local_1198;
  allocator<char> local_1171;
  string local_1170;
  string local_1150;
  allocator<char> local_1129;
  string local_1128;
  string local_1108;
  allocator<char> local_10e1;
  string local_10e0;
  string local_10c0;
  allocator<char> local_1099;
  string local_1098;
  string local_1078;
  allocator<char> local_1051;
  string local_1050;
  string local_1030;
  allocator<char> local_1009;
  string local_1008;
  string local_fe8;
  allocator<char> local_fc1;
  string local_fc0;
  string local_fa0;
  allocator<char> local_f79;
  string local_f78;
  string local_f58;
  allocator<char> local_f31;
  string local_f30;
  string local_f10;
  allocator<char> local_ee9;
  string local_ee8;
  string local_ec8;
  allocator<char> local_ea1;
  string local_ea0;
  string local_e80;
  allocator<char> local_e59;
  string local_e58;
  string local_e38;
  allocator<char> local_e11;
  string local_e10;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  string local_da8;
  allocator<char> local_d81;
  string local_d80;
  string local_d60;
  allocator<char> local_d39;
  string local_d38;
  string local_d18;
  allocator<char> local_cf1;
  string local_cf0;
  string local_cd0;
  allocator<char> local_ca9;
  string local_ca8;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  string local_c40;
  allocator<char> local_c19;
  string local_c18;
  string local_bf8;
  allocator<char> local_bd1;
  string local_bd0;
  string local_bb0;
  allocator<char> local_b89;
  string local_b88;
  string local_b68;
  allocator<char> local_b41;
  string local_b40;
  string local_b20;
  allocator<char> local_af9;
  string local_af8;
  string local_ad8;
  allocator<char> local_ab1;
  string local_ab0;
  string local_a90;
  allocator<char> local_a69;
  string local_a68;
  string local_a48;
  allocator<char> local_a21;
  string local_a20;
  string local_a00;
  allocator<char> local_9d9;
  string local_9d8;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  string local_970;
  allocator<char> local_949;
  string local_948;
  string local_928;
  allocator<char> local_901;
  string local_900;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  string local_898;
  allocator<char> local_871;
  string local_870;
  string local_850;
  allocator<char> local_829;
  string local_828;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  string local_778;
  allocator<char> local_751;
  string local_750;
  string local_730;
  allocator<char> local_709;
  string local_708;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  string local_658;
  allocator<char> local_631;
  string local_630;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  string local_580;
  allocator<char> local_559;
  string local_558;
  string local_538;
  allocator<char> local_511;
  string local_510;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  string local_460;
  allocator<char> local_439;
  string local_438;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  string local_388;
  allocator<char> local_361;
  string local_360;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  undefined1 local_2a8 [8];
  Reader reader;
  Value val;
  string local_178;
  undefined1 local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  AliRpcRequest *local_98;
  AliRpcRequest *req_rpc;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string secheme;
  int local_50;
  bool parse_success;
  int ret;
  int status_code;
  string str_response;
  EssErrorInfo *error_info_local;
  EssDescribeScheduledTasksResponseType *response_local;
  EssDescribeScheduledTasksRequestType *req_local;
  Ess *this_local;
  
  str_response.field_2._8_8_ = error_info;
  std::__cxx11::string::string((string *)&ret);
  secheme.field_2._M_local_buf[0xf] = '\0';
  pcVar3 = "http";
  if ((this->use_tls_ & 1U) != 0) {
    pcVar3 = "https";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,pcVar3,&local_79);
  std::allocator<char>::~allocator(&local_79);
  pAVar4 = (AliRpcRequest *)operator_new(0x2c8);
  local_151 = 1;
  pcVar3 = this->version_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar3,&local_b9);
  pcVar3 = this->appid_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar3,&local_e1);
  pcVar3 = this->secret_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,pcVar3,&local_109);
  std::operator+(&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,"://"
                );
  std::operator+(&local_130,&local_150,this->host_);
  AliRpcRequest::AliRpcRequest(pAVar4,&local_b8,&local_e0,&local_108,&local_130);
  local_151 = 0;
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_98 = pAVar4;
  if ((((this->use_tls_ & 1U) == 0) && (this->proxy_host_ != (char *)0x0)) &&
     (*this->proxy_host_ != '\0')) {
    pcVar3 = this->proxy_host_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,pcVar3,(allocator<char> *)((long)&val.comments_ + 7));
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)pAVar4,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)((long)&val.comments_ + 7));
  }
  Json::Value::Value((Value *)&reader.features_,nullValue);
  Json::Reader::Reader((Reader *)local_2a8);
  pAVar4 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Action",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"DescribeScheduledTasks",&local_2f1);
  AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_2c8,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"OwnerId",&local_319);
    std::__cxx11::string::string((string *)&local_340,(string *)req);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_318,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"ResourceOwnerAccount",&local_361);
    std::__cxx11::string::string((string *)&local_388,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_360,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator(&local_361);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"ResourceOwnerId",&local_3a9);
    std::__cxx11::string::string((string *)&local_3d0,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_3a8,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"PageNumber",&local_3f1)
    ;
    std::__cxx11::string::string((string *)&local_418,(string *)&req->page_number);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_3f0,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"PageSize",&local_439);
    std::__cxx11::string::string((string *)&local_460,(string *)&req->page_size);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_438,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"ScheduledAction.1",&local_481);
    std::__cxx11::string::string((string *)&local_4a8,(string *)&req->scheduled_action1);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_480,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c8,"ScheduledAction.2",&local_4c9);
    std::__cxx11::string::string((string *)&local_4f0,(string *)&req->scheduled_action2);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_4c8,&local_4f0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"ScheduledAction.3",&local_511);
    std::__cxx11::string::string((string *)&local_538,(string *)&req->scheduled_action3);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_510,&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"ScheduledAction.4",&local_559);
    std::__cxx11::string::string((string *)&local_580,(string *)&req->scheduled_action4);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_558,&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator(&local_559);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a0,"ScheduledAction.5",&local_5a1);
    std::__cxx11::string::string((string *)&local_5c8,(string *)&req->scheduled_action5);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_5a0,&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator(&local_5a1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e8,"ScheduledAction.6",&local_5e9);
    std::__cxx11::string::string((string *)&local_610,(string *)&req->scheduled_action6);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_5e8,&local_610);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::allocator<char>::~allocator(&local_5e9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_630,"ScheduledAction.7",&local_631);
    std::__cxx11::string::string((string *)&local_658,(string *)&req->scheduled_action7);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_630,&local_658);
    std::__cxx11::string::~string((string *)&local_658);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator(&local_631);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_678,"ScheduledAction.8",&local_679);
    std::__cxx11::string::string((string *)&local_6a0,(string *)&req->scheduled_action8);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_678,&local_6a0);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::__cxx11::string::~string((string *)&local_678);
    std::allocator<char>::~allocator(&local_679);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c0,"ScheduledAction.9",&local_6c1);
    std::__cxx11::string::string((string *)&local_6e8,(string *)&req->scheduled_action9);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_6c0,&local_6e8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::allocator<char>::~allocator(&local_6c1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_708,"ScheduledAction.10",&local_709);
    std::__cxx11::string::string((string *)&local_730,(string *)&req->scheduled_action10);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_708,&local_730);
    std::__cxx11::string::~string((string *)&local_730);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator(&local_709);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_750,"ScheduledAction.11",&local_751);
    std::__cxx11::string::string((string *)&local_778,(string *)&req->scheduled_action11);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_750,&local_778);
    std::__cxx11::string::~string((string *)&local_778);
    std::__cxx11::string::~string((string *)&local_750);
    std::allocator<char>::~allocator(&local_751);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_798,"ScheduledAction.12",&local_799);
    std::__cxx11::string::string((string *)&local_7c0,(string *)&req->scheduled_action12);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_798,&local_7c0);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::__cxx11::string::~string((string *)&local_798);
    std::allocator<char>::~allocator(&local_799);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e0,"ScheduledAction.13",&local_7e1);
    std::__cxx11::string::string((string *)&local_808,(string *)&req->scheduled_action13);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_7e0,&local_808);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::allocator<char>::~allocator(&local_7e1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_828,"ScheduledAction.14",&local_829);
    std::__cxx11::string::string((string *)&local_850,(string *)&req->scheduled_action14);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_828,&local_850);
    std::__cxx11::string::~string((string *)&local_850);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator(&local_829);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_870,"ScheduledAction.15",&local_871);
    std::__cxx11::string::string((string *)&local_898,(string *)&req->scheduled_action15);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_870,&local_898);
    std::__cxx11::string::~string((string *)&local_898);
    std::__cxx11::string::~string((string *)&local_870);
    std::allocator<char>::~allocator(&local_871);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b8,"ScheduledAction.16",&local_8b9);
    std::__cxx11::string::string((string *)&local_8e0,(string *)&req->scheduled_action16);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_8b8,&local_8e0);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::allocator<char>::~allocator(&local_8b9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_900,"ScheduledAction.17",&local_901);
    std::__cxx11::string::string((string *)&local_928,(string *)&req->scheduled_action17);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_900,&local_928);
    std::__cxx11::string::~string((string *)&local_928);
    std::__cxx11::string::~string((string *)&local_900);
    std::allocator<char>::~allocator(&local_901);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_948,"ScheduledAction.18",&local_949);
    std::__cxx11::string::string((string *)&local_970,(string *)&req->scheduled_action18);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_948,&local_970);
    std::__cxx11::string::~string((string *)&local_970);
    std::__cxx11::string::~string((string *)&local_948);
    std::allocator<char>::~allocator(&local_949);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_990,"ScheduledAction.19",&local_991);
    std::__cxx11::string::string((string *)&local_9b8,(string *)&req->scheduled_action19);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_990,&local_9b8);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::__cxx11::string::~string((string *)&local_990);
    std::allocator<char>::~allocator(&local_991);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9d8,"ScheduledAction.20",&local_9d9);
    std::__cxx11::string::string((string *)&local_a00,(string *)&req->scheduled_action20);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_9d8,&local_a00);
    std::__cxx11::string::~string((string *)&local_a00);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::allocator<char>::~allocator(&local_9d9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a20,"ScheduledTaskId.1",&local_a21);
    std::__cxx11::string::string((string *)&local_a48,(string *)&req->scheduled_task_id1);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_a20,&local_a48);
    std::__cxx11::string::~string((string *)&local_a48);
    std::__cxx11::string::~string((string *)&local_a20);
    std::allocator<char>::~allocator(&local_a21);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a68,"ScheduledTaskId.2",&local_a69);
    std::__cxx11::string::string((string *)&local_a90,(string *)&req->scheduled_task_id2);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_a68,&local_a90);
    std::__cxx11::string::~string((string *)&local_a90);
    std::__cxx11::string::~string((string *)&local_a68);
    std::allocator<char>::~allocator(&local_a69);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ab0,"ScheduledTaskId.3",&local_ab1);
    std::__cxx11::string::string((string *)&local_ad8,(string *)&req->scheduled_task_id3);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_ab0,&local_ad8);
    std::__cxx11::string::~string((string *)&local_ad8);
    std::__cxx11::string::~string((string *)&local_ab0);
    std::allocator<char>::~allocator(&local_ab1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af8,"ScheduledTaskId.4",&local_af9);
    std::__cxx11::string::string((string *)&local_b20,(string *)&req->scheduled_task_id4);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_af8,&local_b20);
    std::__cxx11::string::~string((string *)&local_b20);
    std::__cxx11::string::~string((string *)&local_af8);
    std::allocator<char>::~allocator(&local_af9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b40,"ScheduledTaskId.5",&local_b41);
    std::__cxx11::string::string((string *)&local_b68,(string *)&req->scheduled_task_id5);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_b40,&local_b68);
    std::__cxx11::string::~string((string *)&local_b68);
    std::__cxx11::string::~string((string *)&local_b40);
    std::allocator<char>::~allocator(&local_b41);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b88,"ScheduledTaskId.6",&local_b89);
    std::__cxx11::string::string((string *)&local_bb0,(string *)&req->scheduled_task_id6);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_b88,&local_bb0);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::~string((string *)&local_b88);
    std::allocator<char>::~allocator(&local_b89);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bd0,"ScheduledTaskId.7",&local_bd1);
    std::__cxx11::string::string((string *)&local_bf8,(string *)&req->scheduled_task_id7);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_bd0,&local_bf8);
    std::__cxx11::string::~string((string *)&local_bf8);
    std::__cxx11::string::~string((string *)&local_bd0);
    std::allocator<char>::~allocator(&local_bd1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c18,"ScheduledTaskId.8",&local_c19);
    std::__cxx11::string::string((string *)&local_c40,(string *)&req->scheduled_task_id8);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_c18,&local_c40);
    std::__cxx11::string::~string((string *)&local_c40);
    std::__cxx11::string::~string((string *)&local_c18);
    std::allocator<char>::~allocator(&local_c19);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c60,"ScheduledTaskId.9",&local_c61);
    std::__cxx11::string::string((string *)&local_c88,(string *)&req->scheduled_task_id9);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_c60,&local_c88);
    std::__cxx11::string::~string((string *)&local_c88);
    std::__cxx11::string::~string((string *)&local_c60);
    std::allocator<char>::~allocator(&local_c61);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ca8,"ScheduledTaskId.10",&local_ca9);
    std::__cxx11::string::string((string *)&local_cd0,(string *)&req->scheduled_task_id10);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_ca8,&local_cd0);
    std::__cxx11::string::~string((string *)&local_cd0);
    std::__cxx11::string::~string((string *)&local_ca8);
    std::allocator<char>::~allocator(&local_ca9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cf0,"ScheduledTaskId.11",&local_cf1);
    std::__cxx11::string::string((string *)&local_d18,(string *)&req->scheduled_task_id11);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_cf0,&local_d18);
    std::__cxx11::string::~string((string *)&local_d18);
    std::__cxx11::string::~string((string *)&local_cf0);
    std::allocator<char>::~allocator(&local_cf1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d38,"ScheduledTaskId.12",&local_d39);
    std::__cxx11::string::string((string *)&local_d60,(string *)&req->scheduled_task_id12);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_d38,&local_d60);
    std::__cxx11::string::~string((string *)&local_d60);
    std::__cxx11::string::~string((string *)&local_d38);
    std::allocator<char>::~allocator(&local_d39);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d80,"ScheduledTaskId.13",&local_d81);
    std::__cxx11::string::string((string *)&local_da8,(string *)&req->scheduled_task_id13);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_d80,&local_da8);
    std::__cxx11::string::~string((string *)&local_da8);
    std::__cxx11::string::~string((string *)&local_d80);
    std::allocator<char>::~allocator(&local_d81);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_dc8,"ScheduledTaskId.14",&local_dc9);
    std::__cxx11::string::string((string *)&local_df0,(string *)&req->scheduled_task_id14);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_dc8,&local_df0);
    std::__cxx11::string::~string((string *)&local_df0);
    std::__cxx11::string::~string((string *)&local_dc8);
    std::allocator<char>::~allocator(&local_dc9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e10,"ScheduledTaskId.15",&local_e11);
    std::__cxx11::string::string((string *)&local_e38,(string *)&req->scheduled_task_id15);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_e10,&local_e38);
    std::__cxx11::string::~string((string *)&local_e38);
    std::__cxx11::string::~string((string *)&local_e10);
    std::allocator<char>::~allocator(&local_e11);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e58,"ScheduledTaskId.16",&local_e59);
    std::__cxx11::string::string((string *)&local_e80,(string *)&req->scheduled_task_id16);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_e58,&local_e80);
    std::__cxx11::string::~string((string *)&local_e80);
    std::__cxx11::string::~string((string *)&local_e58);
    std::allocator<char>::~allocator(&local_e59);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ea0,"ScheduledTaskId.17",&local_ea1);
    std::__cxx11::string::string((string *)&local_ec8,(string *)&req->scheduled_task_id17);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_ea0,&local_ec8);
    std::__cxx11::string::~string((string *)&local_ec8);
    std::__cxx11::string::~string((string *)&local_ea0);
    std::allocator<char>::~allocator(&local_ea1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ee8,"ScheduledTaskId.18",&local_ee9);
    std::__cxx11::string::string((string *)&local_f10,(string *)&req->scheduled_task_id18);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_ee8,&local_f10);
    std::__cxx11::string::~string((string *)&local_f10);
    std::__cxx11::string::~string((string *)&local_ee8);
    std::allocator<char>::~allocator(&local_ee9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f30,"ScheduledTaskId.19",&local_f31);
    std::__cxx11::string::string((string *)&local_f58,(string *)&req->scheduled_task_id19);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_f30,&local_f58);
    std::__cxx11::string::~string((string *)&local_f58);
    std::__cxx11::string::~string((string *)&local_f30);
    std::allocator<char>::~allocator(&local_f31);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f78,"ScheduledTaskId.20",&local_f79);
    std::__cxx11::string::string((string *)&local_fa0,(string *)&req->scheduled_task_id20);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_f78,&local_fa0);
    std::__cxx11::string::~string((string *)&local_fa0);
    std::__cxx11::string::~string((string *)&local_f78);
    std::allocator<char>::~allocator(&local_f79);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fc0,"ScheduledTaskName.1",&local_fc1);
    std::__cxx11::string::string((string *)&local_fe8,(string *)&req->scheduled_task_name1);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_fc0,&local_fe8);
    std::__cxx11::string::~string((string *)&local_fe8);
    std::__cxx11::string::~string((string *)&local_fc0);
    std::allocator<char>::~allocator(&local_fc1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1008,"ScheduledTaskName.2",&local_1009);
    std::__cxx11::string::string((string *)&local_1030,(string *)&req->scheduled_task_name2);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1008,&local_1030);
    std::__cxx11::string::~string((string *)&local_1030);
    std::__cxx11::string::~string((string *)&local_1008);
    std::allocator<char>::~allocator(&local_1009);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1050,"ScheduledTaskName.3",&local_1051);
    std::__cxx11::string::string((string *)&local_1078,(string *)&req->scheduled_task_name3);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1050,&local_1078);
    std::__cxx11::string::~string((string *)&local_1078);
    std::__cxx11::string::~string((string *)&local_1050);
    std::allocator<char>::~allocator(&local_1051);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1098,"ScheduledTaskName.4",&local_1099);
    std::__cxx11::string::string((string *)&local_10c0,(string *)&req->scheduled_task_name4);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1098,&local_10c0);
    std::__cxx11::string::~string((string *)&local_10c0);
    std::__cxx11::string::~string((string *)&local_1098);
    std::allocator<char>::~allocator(&local_1099);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10e0,"ScheduledTaskName.5",&local_10e1);
    std::__cxx11::string::string((string *)&local_1108,(string *)&req->scheduled_task_name5);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_10e0,&local_1108);
    std::__cxx11::string::~string((string *)&local_1108);
    std::__cxx11::string::~string((string *)&local_10e0);
    std::allocator<char>::~allocator(&local_10e1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1128,"ScheduledTaskName.6",&local_1129);
    std::__cxx11::string::string((string *)&local_1150,(string *)&req->scheduled_task_name6);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1128,&local_1150);
    std::__cxx11::string::~string((string *)&local_1150);
    std::__cxx11::string::~string((string *)&local_1128);
    std::allocator<char>::~allocator(&local_1129);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1170,"ScheduledTaskName.7",&local_1171);
    std::__cxx11::string::string((string *)&local_1198,(string *)&req->scheduled_task_name7);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1170,&local_1198);
    std::__cxx11::string::~string((string *)&local_1198);
    std::__cxx11::string::~string((string *)&local_1170);
    std::allocator<char>::~allocator(&local_1171);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11b8,"ScheduledTaskName.8",&local_11b9);
    std::__cxx11::string::string((string *)&local_11e0,(string *)&req->scheduled_task_name8);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_11b8,&local_11e0);
    std::__cxx11::string::~string((string *)&local_11e0);
    std::__cxx11::string::~string((string *)&local_11b8);
    std::allocator<char>::~allocator(&local_11b9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1200,"ScheduledTaskName.9",&local_1201);
    std::__cxx11::string::string((string *)&local_1228,(string *)&req->scheduled_task_name9);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1200,&local_1228);
    std::__cxx11::string::~string((string *)&local_1228);
    std::__cxx11::string::~string((string *)&local_1200);
    std::allocator<char>::~allocator(&local_1201);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1248,"ScheduledTaskName.10",&local_1249);
    std::__cxx11::string::string((string *)&local_1270,(string *)&req->scheduled_task_name10);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1248,&local_1270);
    std::__cxx11::string::~string((string *)&local_1270);
    std::__cxx11::string::~string((string *)&local_1248);
    std::allocator<char>::~allocator(&local_1249);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1290,"ScheduledTaskName.11",&local_1291);
    std::__cxx11::string::string((string *)&local_12b8,(string *)&req->scheduled_task_name11);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1290,&local_12b8);
    std::__cxx11::string::~string((string *)&local_12b8);
    std::__cxx11::string::~string((string *)&local_1290);
    std::allocator<char>::~allocator(&local_1291);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12d8,"ScheduledTaskName.12",&local_12d9);
    std::__cxx11::string::string((string *)&local_1300,(string *)&req->scheduled_task_name12);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_12d8,&local_1300);
    std::__cxx11::string::~string((string *)&local_1300);
    std::__cxx11::string::~string((string *)&local_12d8);
    std::allocator<char>::~allocator(&local_12d9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1320,"ScheduledTaskName.13",&local_1321);
    std::__cxx11::string::string((string *)&local_1348,(string *)&req->scheduled_task_name13);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1320,&local_1348);
    std::__cxx11::string::~string((string *)&local_1348);
    std::__cxx11::string::~string((string *)&local_1320);
    std::allocator<char>::~allocator(&local_1321);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1368,"ScheduledTaskName.14",&local_1369);
    std::__cxx11::string::string((string *)&local_1390,(string *)&req->scheduled_task_name14);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1368,&local_1390);
    std::__cxx11::string::~string((string *)&local_1390);
    std::__cxx11::string::~string((string *)&local_1368);
    std::allocator<char>::~allocator(&local_1369);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13b0,"ScheduledTaskName.15",&local_13b1);
    std::__cxx11::string::string((string *)&local_13d8,(string *)&req->scheduled_task_name15);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_13b0,&local_13d8);
    std::__cxx11::string::~string((string *)&local_13d8);
    std::__cxx11::string::~string((string *)&local_13b0);
    std::allocator<char>::~allocator(&local_13b1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13f8,"ScheduledTaskName.16",&local_13f9);
    std::__cxx11::string::string((string *)&local_1420,(string *)&req->scheduled_task_name16);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_13f8,&local_1420);
    std::__cxx11::string::~string((string *)&local_1420);
    std::__cxx11::string::~string((string *)&local_13f8);
    std::allocator<char>::~allocator(&local_13f9);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1440,"ScheduledTaskName.17",&local_1441);
    std::__cxx11::string::string((string *)&local_1468,(string *)&req->scheduled_task_name17);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1440,&local_1468);
    std::__cxx11::string::~string((string *)&local_1468);
    std::__cxx11::string::~string((string *)&local_1440);
    std::allocator<char>::~allocator(&local_1441);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1488,"ScheduledTaskName.18",&local_1489);
    std::__cxx11::string::string((string *)&local_14b0,(string *)&req->scheduled_task_name18);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1488,&local_14b0);
    std::__cxx11::string::~string((string *)&local_14b0);
    std::__cxx11::string::~string((string *)&local_1488);
    std::allocator<char>::~allocator(&local_1489);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14d0,"ScheduledTaskName.19",&local_14d1);
    std::__cxx11::string::string((string *)&local_14f8,(string *)&req->scheduled_task_name19);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_14d0,&local_14f8);
    std::__cxx11::string::~string((string *)&local_14f8);
    std::__cxx11::string::~string((string *)&local_14d0);
    std::allocator<char>::~allocator(&local_14d1);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1518,"ScheduledTaskName.20",&local_1519);
    std::__cxx11::string::string((string *)&local_1540,(string *)&req->scheduled_task_name20);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1518,&local_1540);
    std::__cxx11::string::~string((string *)&local_1540);
    std::__cxx11::string::~string((string *)&local_1518);
    std::allocator<char>::~allocator(&local_1519);
  }
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1560,"OwnerAccount",&local_1561);
    std::__cxx11::string::string((string *)&local_1588,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_1560,&local_1588);
    std::__cxx11::string::~string((string *)&local_1588);
    std::__cxx11::string::~string((string *)&local_1560);
    std::allocator<char>::~allocator(&local_1561);
  }
  pAVar4 = local_98;
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_15a8,"RegionId",&local_15a9)
    ;
    pcVar3 = this->region_id_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_15d0,pcVar3,&local_15d1);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_15a8,&local_15d0);
    std::__cxx11::string::~string((string *)&local_15d0);
    std::allocator<char>::~allocator(&local_15d1);
    std::__cxx11::string::~string((string *)&local_15a8);
    std::allocator<char>::~allocator(&local_15a9);
  }
  iVar2 = (**(local_98->super_AliHttpRequest)._vptr_AliHttpRequest)();
  if (iVar2 == 0) {
    local_50 = AliHttpRequest::WaitResponseHeaderComplete(&local_98->super_AliHttpRequest);
    AliHttpRequest::ReadResponseBody(&local_98->super_AliHttpRequest,(string *)&ret);
    if ((0 < local_50) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      secheme.field_2._M_local_buf[0xf] =
           Json::Reader::parse((Reader *)local_2a8,(string *)&ret,(Value *)&reader.features_,true);
    }
    if ((secheme.field_2._M_local_buf[0xf] & 1U) == 0) {
      if (str_response.field_2._8_8_ != 0) {
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),"parse response failed");
      }
      local_50 = -1;
    }
    else {
      if (((local_50 != 200) && (str_response.field_2._8_8_ != 0)) &&
         ((secheme.field_2._M_local_buf[0xf] & 1U) != 0)) {
        local_15fa = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"RequestId");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_15f8,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_15fa = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_15f8,anon_var_dwarf_e09dc + 9,&local_15f9);
        }
        std::__cxx11::string::operator=((string *)str_response.field_2._8_8_,(string *)&local_15f8);
        std::__cxx11::string::~string((string *)&local_15f8);
        if ((local_15fa & 1) != 0) {
          std::allocator<char>::~allocator(&local_15f9);
        }
        local_1622 = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"Code");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"Code");
          Json::Value::asString_abi_cxx11_(&local_1620,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_1622 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1620,anon_var_dwarf_e09dc + 9,&local_1621);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),(string *)&local_1620);
        std::__cxx11::string::~string((string *)&local_1620);
        if ((local_1622 & 1) != 0) {
          std::allocator<char>::~allocator(&local_1621);
        }
        local_164a = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"HostId");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"HostId");
          Json::Value::asString_abi_cxx11_(&local_1648,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_164a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1648,anon_var_dwarf_e09dc + 9,&local_1649);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x60),(string *)&local_1648);
        std::__cxx11::string::~string((string *)&local_1648);
        if ((local_164a & 1) != 0) {
          std::allocator<char>::~allocator(&local_1649);
        }
        local_1672 = Json::Value::isMember((Value *)&reader.features_,"Message");
        if (local_1672) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"Message");
          Json::Value::asString_abi_cxx11_(&local_1670,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1670,anon_var_dwarf_e09dc + 9,&local_1671);
        }
        local_1672 = !local_1672;
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x40),(string *)&local_1670);
        std::__cxx11::string::~string((string *)&local_1670);
        if (local_1672) {
          std::allocator<char>::~allocator(&local_1671);
        }
      }
      if ((local_50 == 200) && (response != (EssDescribeScheduledTasksResponseType *)0x0)) {
        anon_unknown.dwarf_5ccd1::Json2Type((Value *)&reader.features_,response);
      }
    }
  }
  else {
    if (str_response.field_2._8_8_ != 0) {
      std::__cxx11::string::operator=
                ((string *)(str_response.field_2._8_8_ + 0x20),"connect to host failed");
    }
    local_50 = -1;
  }
  pAVar4 = local_98;
  if (local_98 != (AliRpcRequest *)0x0) {
    AliRpcRequest::~AliRpcRequest(local_98);
    operator_delete(pAVar4,0x2c8);
  }
  Json::Reader::~Reader((Reader *)local_2a8);
  Json::Value::~Value((Value *)&reader.features_);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&ret);
  return local_50;
}

Assistant:

int Ess::DescribeScheduledTasks(const EssDescribeScheduledTasksRequestType& req,
                      EssDescribeScheduledTasksResponseType* response,
                       EssErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeScheduledTasks");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.scheduled_action1.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.1", req.scheduled_action1);
  }
  if(!req.scheduled_action2.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.2", req.scheduled_action2);
  }
  if(!req.scheduled_action3.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.3", req.scheduled_action3);
  }
  if(!req.scheduled_action4.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.4", req.scheduled_action4);
  }
  if(!req.scheduled_action5.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.5", req.scheduled_action5);
  }
  if(!req.scheduled_action6.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.6", req.scheduled_action6);
  }
  if(!req.scheduled_action7.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.7", req.scheduled_action7);
  }
  if(!req.scheduled_action8.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.8", req.scheduled_action8);
  }
  if(!req.scheduled_action9.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.9", req.scheduled_action9);
  }
  if(!req.scheduled_action10.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.10", req.scheduled_action10);
  }
  if(!req.scheduled_action11.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.11", req.scheduled_action11);
  }
  if(!req.scheduled_action12.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.12", req.scheduled_action12);
  }
  if(!req.scheduled_action13.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.13", req.scheduled_action13);
  }
  if(!req.scheduled_action14.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.14", req.scheduled_action14);
  }
  if(!req.scheduled_action15.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.15", req.scheduled_action15);
  }
  if(!req.scheduled_action16.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.16", req.scheduled_action16);
  }
  if(!req.scheduled_action17.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.17", req.scheduled_action17);
  }
  if(!req.scheduled_action18.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.18", req.scheduled_action18);
  }
  if(!req.scheduled_action19.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.19", req.scheduled_action19);
  }
  if(!req.scheduled_action20.empty()) {
    req_rpc->AddRequestQuery("ScheduledAction.20", req.scheduled_action20);
  }
  if(!req.scheduled_task_id1.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.1", req.scheduled_task_id1);
  }
  if(!req.scheduled_task_id2.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.2", req.scheduled_task_id2);
  }
  if(!req.scheduled_task_id3.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.3", req.scheduled_task_id3);
  }
  if(!req.scheduled_task_id4.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.4", req.scheduled_task_id4);
  }
  if(!req.scheduled_task_id5.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.5", req.scheduled_task_id5);
  }
  if(!req.scheduled_task_id6.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.6", req.scheduled_task_id6);
  }
  if(!req.scheduled_task_id7.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.7", req.scheduled_task_id7);
  }
  if(!req.scheduled_task_id8.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.8", req.scheduled_task_id8);
  }
  if(!req.scheduled_task_id9.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.9", req.scheduled_task_id9);
  }
  if(!req.scheduled_task_id10.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.10", req.scheduled_task_id10);
  }
  if(!req.scheduled_task_id11.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.11", req.scheduled_task_id11);
  }
  if(!req.scheduled_task_id12.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.12", req.scheduled_task_id12);
  }
  if(!req.scheduled_task_id13.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.13", req.scheduled_task_id13);
  }
  if(!req.scheduled_task_id14.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.14", req.scheduled_task_id14);
  }
  if(!req.scheduled_task_id15.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.15", req.scheduled_task_id15);
  }
  if(!req.scheduled_task_id16.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.16", req.scheduled_task_id16);
  }
  if(!req.scheduled_task_id17.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.17", req.scheduled_task_id17);
  }
  if(!req.scheduled_task_id18.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.18", req.scheduled_task_id18);
  }
  if(!req.scheduled_task_id19.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.19", req.scheduled_task_id19);
  }
  if(!req.scheduled_task_id20.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskId.20", req.scheduled_task_id20);
  }
  if(!req.scheduled_task_name1.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.1", req.scheduled_task_name1);
  }
  if(!req.scheduled_task_name2.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.2", req.scheduled_task_name2);
  }
  if(!req.scheduled_task_name3.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.3", req.scheduled_task_name3);
  }
  if(!req.scheduled_task_name4.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.4", req.scheduled_task_name4);
  }
  if(!req.scheduled_task_name5.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.5", req.scheduled_task_name5);
  }
  if(!req.scheduled_task_name6.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.6", req.scheduled_task_name6);
  }
  if(!req.scheduled_task_name7.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.7", req.scheduled_task_name7);
  }
  if(!req.scheduled_task_name8.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.8", req.scheduled_task_name8);
  }
  if(!req.scheduled_task_name9.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.9", req.scheduled_task_name9);
  }
  if(!req.scheduled_task_name10.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.10", req.scheduled_task_name10);
  }
  if(!req.scheduled_task_name11.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.11", req.scheduled_task_name11);
  }
  if(!req.scheduled_task_name12.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.12", req.scheduled_task_name12);
  }
  if(!req.scheduled_task_name13.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.13", req.scheduled_task_name13);
  }
  if(!req.scheduled_task_name14.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.14", req.scheduled_task_name14);
  }
  if(!req.scheduled_task_name15.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.15", req.scheduled_task_name15);
  }
  if(!req.scheduled_task_name16.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.16", req.scheduled_task_name16);
  }
  if(!req.scheduled_task_name17.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.17", req.scheduled_task_name17);
  }
  if(!req.scheduled_task_name18.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.18", req.scheduled_task_name18);
  }
  if(!req.scheduled_task_name19.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.19", req.scheduled_task_name19);
  }
  if(!req.scheduled_task_name20.empty()) {
    req_rpc->AddRequestQuery("ScheduledTaskName.20", req.scheduled_task_name20);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}